

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<float,int,double>
                 (size_t col_num,size_t nrows,float *Xc,int *Xc_ind,int *Xc_indptr,
                 MissingAction missing_action,float *w)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double __z;
  double dVar8;
  undefined1 auVar9 [16];
  double __z_00;
  double dVar10;
  double dVar11;
  double local_88;
  double local_80;
  
  iVar1 = Xc_indptr[col_num];
  lVar5 = (long)iVar1;
  iVar2 = Xc_indptr[col_num + 1];
  lVar6 = (long)iVar2;
  if (iVar2 != iVar1) {
    lVar4 = nrows - (long)(iVar2 - iVar1);
    auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = 0x45300000;
    dVar11 = (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    lVar4 = lVar5;
    if (iVar1 < iVar2) {
      do {
        dVar11 = dVar11 + (double)w[Xc_ind[lVar4]];
        lVar4 = lVar4 + 1;
      } while (lVar6 != lVar4);
    }
    if (0.0 < dVar11) {
      if (missing_action == Fail) {
        if (iVar1 < iVar2) {
          __z_00 = 0.0;
          local_88 = 0.0;
          __z = 0.0;
          local_80 = 0.0;
          do {
            dVar7 = (double)w[Xc_ind[lVar5]];
            dVar8 = (double)Xc[lVar5];
            dVar10 = dVar8 * dVar8;
            __z_00 = fma(dVar7,dVar8,__z_00);
            local_88 = fma(dVar7,dVar10,local_88);
            local_80 = fma(dVar7,dVar8 * dVar10,local_80);
            __z = fma(dVar7,dVar10 * dVar10,__z);
            lVar5 = lVar5 + 1;
          } while (lVar6 != lVar5);
        }
        else {
          local_80 = 0.0;
          __z = 0.0;
          local_88 = 0.0;
          __z_00 = 0.0;
        }
      }
      else {
        if (iVar1 < iVar2) {
          __z_00 = 0.0;
          local_88 = 0.0;
          __z = 0.0;
          local_80 = 0.0;
          do {
            dVar7 = (double)w[Xc_ind[lVar5]];
            dVar8 = (double)Xc[lVar5];
            if ((NAN(Xc[lVar5])) || (ABS(dVar8) == INFINITY)) {
              dVar11 = dVar11 - dVar7;
            }
            else {
              dVar10 = dVar8 * dVar8;
              __z_00 = fma(dVar7,dVar8,__z_00);
              local_88 = fma(dVar7,dVar10,local_88);
              local_80 = fma(dVar7,dVar8 * dVar10,local_80);
              __z = fma(dVar7,dVar10 * dVar10,__z);
            }
            lVar5 = lVar5 + 1;
          } while (lVar6 != lVar5);
        }
        else {
          local_80 = 0.0;
          __z = 0.0;
          local_88 = 0.0;
          __z_00 = 0.0;
        }
        if (dVar11 <= 0.0) {
          return -INFINITY;
        }
      }
      if ((1.0 < dVar11) && ((local_88 != 0.0 || (NAN(local_88))))) {
        if ((local_88 != __z_00 * __z_00) || (NAN(local_88) || NAN(__z_00 * __z_00))) {
          dVar10 = __z_00 / dVar11;
          dVar8 = dVar10 * dVar10;
          dVar7 = local_88 / dVar11 - dVar8;
          if ((!NAN(dVar7)) &&
             (((2.220446049250313e-16 < dVar7 ||
               ((bVar3 = check_more_than_two_unique_values<float,int>
                                   (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action), 0.0 < dVar7
                && (bVar3)))) &&
              (dVar11 = (dVar8 * dVar10 * dVar10 * dVar11 +
                        __z_00 * -4.0 * dVar8 * dVar10 +
                        local_88 * 6.0 * dVar8 + local_80 * -4.0 * dVar10 + __z) /
                        (dVar7 * dVar7 * dVar11), (long)ABS(dVar11) < 0x7ff0000000000000)))) {
            if (dVar11 <= 0.0) {
              return 0.0;
            }
            return dVar11;
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t col_num, size_t nrows,
                              real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, real_t *restrict w)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = nrows - (Xc_indptr[col_num + 1] - Xc_indptr[col_num]);
    for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        cnt += w[Xc_ind[ix]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            if (unlikely(is_na_or_inf(xval)))
            {
                cnt -= w_this;
            }

            else
            {
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);
            }
        }

        if (cnt <= 0) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            x_sq = xval * xval;
            s1 = std::fma(w_this, xval, s1);
            s2 = std::fma(w_this, x_sq, s2);
            s3 = std::fma(w_this, x_sq*xval, s3);
            s4 = std::fma(w_this, x_sq*x_sq, s4);
            // s1 += w_this * pw1(xval);
            // s2 += w_this * pw2(xval);
            // s3 += w_this * pw3(xval);
            // s4 += w_this * pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return -HUGE_VAL;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}